

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

int Fra_ImpRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vImps)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  Fra_Sml_t *pFVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  void *pvVar11;
  
  if (vImps->nSize < 1) {
    iVar6 = 0;
  }
  else {
    piVar3 = vImps->pArray;
    lVar7 = 0;
    iVar6 = 0;
    do {
      uVar9 = piVar3[lVar7];
      if ((ulong)uVar9 != 0) {
        pVVar4 = p->pManAig->vObjs;
        if (pVVar4 == (Vec_Ptr_t *)0x0) {
          pvVar11 = (void *)0x0;
        }
        else {
          uVar8 = (ulong)uVar9 & 0xffff;
          if (pVVar4->nSize <= (int)uVar8) goto LAB_005cdee2;
          pvVar11 = pVVar4->pArray[uVar8];
        }
        uVar9 = (int)uVar9 >> 0x10;
        if (((int)uVar9 < 0) || (pVVar4->nSize <= (int)uVar9)) {
LAB_005cdee2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pFVar5 = p->pSml;
        iVar1 = pFVar5->nWordsTotal;
        iVar2 = pFVar5->nWordsPref;
        if (iVar2 < iVar1) {
          lVar10 = 0;
          do {
            if ((*(uint *)((long)&pFVar5[1].pAig +
                          lVar10 * 4 +
                          (long)(*(int *)((long)pvVar11 + 0x24) * iVar1) * 4 + (long)iVar2 * 4) &
                ~*(uint *)((long)&pFVar5[1].pAig +
                          lVar10 * 4 +
                          (long)(*(int *)((long)pVVar4->pArray[uVar9] + 0x24) * iVar1) * 4 +
                          (long)iVar2 * 4)) != 0) {
              piVar3[lVar7] = 0;
              iVar6 = 1;
              break;
            }
            lVar10 = lVar10 + 1;
          } while (iVar1 - iVar2 != (int)lVar10);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vImps->nSize);
  }
  return iVar6;
}

Assistant:

int Fra_ImpRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vImps )
{
    Aig_Obj_t * pLeft, * pRight;
    int Imp, i, RetValue = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if implication holds using this simulation info
        if ( !Sml_NodeCheckImp(p->pSml, pLeft->Id, pRight->Id) )
        {
            Vec_IntWriteEntry( vImps, i, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}